

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandInInventory::Tick
          (CommandInInventory *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  PClassActor *pPVar1;
  long *plVar2;
  bool bVar3;
  AInventory *pAVar4;
  AInventory *pAVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = (ulong)*(uint *)((long)this->item + (ulong)(byte)this->field_0x30 * 0x10 + -0x1c);
  if (uVar7 != 0) {
    pPVar1 = this->item[(ulong)(byte)this->field_0x30 * 2 + -5];
    lVar8 = 0;
    do {
      plVar2 = *(long **)((long)&(pPVar1->super_PClass).super_PStruct.super_PNamedType.
                                 super_PCompoundType.super_PType + lVar8);
      (**(code **)(*plVar2 + 0x28))(plVar2,block,statusBar,hudChanged);
      lVar8 = lVar8 + 8;
    } while (uVar7 << 3 != lVar8);
  }
  bVar6 = false;
  pAVar4 = AActor::FindInventory
                     (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,this->item[0],
                      false);
  pAVar5 = AActor::FindInventory
                     (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,this->item[1],
                      false);
  if (pAVar4 != (AInventory *)0x0) {
    if (this->amount[0] < 1) {
      bVar6 = true;
    }
    else {
      bVar6 = this->amount[0] <= pAVar4->Amount;
    }
  }
  if (pAVar5 == (AInventory *)0x0) {
    bVar3 = false;
  }
  else if (this->amount[1] < 1) {
    bVar3 = true;
  }
  else {
    bVar3 = this->amount[1] <= pAVar5->Amount;
  }
  if (this->item[1] == (PClassActor *)0x0) {
    if ((bool)this->field_0x30 == bVar6) {
      return;
    }
  }
  else {
    if (this->conditionAnd == true) {
      bVar6 = (bool)(bVar6 & bVar3);
    }
    else {
      bVar6 = (bool)(bVar6 | bVar3);
    }
    if ((bool)this->field_0x30 == bVar6) {
      return;
    }
  }
  this->field_0x30 = bVar6;
  if (block == (SBarInfoMainBlock *)0x0) {
    return;
  }
  (**(code **)(*(long *)this + 0x28))(this,block,statusBar,1);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoNegatableFlowControl::Tick(block, statusBar, hudChanged);

			AInventory *invItem[2] = { statusBar->CPlayer->mo->FindInventory(item[0]), statusBar->CPlayer->mo->FindInventory(item[1]) };
			if (invItem[0] != NULL && amount[0] > 0 && invItem[0]->Amount < amount[0]) invItem[0] = NULL;
			if (invItem[1] != NULL && amount[1] > 0 && invItem[1]->Amount < amount[1]) invItem[1] = NULL;

			if (item[1])
			{
				if (conditionAnd)
					SetTruth(invItem[0] && invItem[1], block, statusBar);
				else
					SetTruth(invItem[0] || invItem[1], block, statusBar);
			}
			else
				SetTruth(invItem[0] != NULL, block, statusBar);
		}